

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cpp
# Opt level: O1

string * format_abi_cxx11_(string *__return_storage_ptr__,char *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args_len;
  va_list args;
  undefined8 local_118;
  void **local_110;
  undefined1 *local_108;
  undefined8 local_f8;
  void **local_f0;
  undefined1 *local_e8;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  local_108 = local_d8;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_f8 = 0x3000000010;
  local_110 = &args_len[0].overflow_arg_area;
  local_118 = 0x3000000010;
  local_f0 = local_110;
  local_e8 = local_108;
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  iVar1 = vsnprintf((char *)0x0,0,fmt,&local_118);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)iVar1);
  vsnprintf((__return_storage_ptr__->_M_dataplus)._M_p,(long)(iVar1 + 1),fmt,&local_f8);
  return __return_storage_ptr__;
}

Assistant:

std::string format(const char* fmt, ...) {
	va_list args, args_len;
	va_start(args, fmt);
	va_copy(args_len, args);
	const int len = vsnprintf(nullptr, 0, fmt, args_len);
	va_end(args_len);

	std::string ret = std::string(len, ' ');
	vsnprintf(&ret.front(), len + 1, fmt, args);
	va_end(args);

	return ret;
}